

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_NumberIsInteger(JSContext *ctx,JSValue val)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double d;
  
  uVar2 = 0;
  if (((int)val.tag == 7) || ((int)val.tag == 0)) {
    iVar1 = JS_ToFloat64(ctx,&d,val);
    if (iVar1 == 0) {
      if ((ulong)ABS(d) < 0x7ff0000000000000) {
        dVar3 = floor(d);
        uVar2 = -(uint)(dVar3 == d) & 1;
      }
    }
    else {
      uVar2 = 0xffffffff;
    }
  }
  return uVar2;
}

Assistant:

static int JS_NumberIsInteger(JSContext *ctx, JSValueConst val)
{
    double d;
    if (!JS_IsNumber(val))
        return FALSE;
    if (unlikely(JS_ToFloat64(ctx, &d, val)))
        return -1;
    return isfinite(d) && floor(d) == d;
}